

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pagecontrol.cpp
# Opt level: O2

int __thiscall QtMWidgets::PageControlPrivate::init(PageControlPrivate *this,EVP_PKEY_CTX *ctx)

{
  undefined8 uVar1;
  int iVar2;
  QColor *pQVar3;
  double dVar4;
  QColor QVar5;
  QStyleOption opt;
  QPalette local_28 [24];
  
  QStyleOption::QStyleOption(&opt,1,0);
  QStyleOption::initFrom((QWidget *)&opt);
  pQVar3 = QPalette::color(local_28,Highlight);
  uVar1 = *(undefined8 *)pQVar3;
  *(undefined8 *)((long)&(this->currentPageIndicatorColor).ct + 2) =
       *(undefined8 *)((long)&pQVar3->ct + 2);
  *(undefined8 *)&this->currentPageIndicatorColor = uVar1;
  QVar5 = lighterColor(&this->currentPageIndicatorColor,0x4b);
  *(long *)&this->pageIndicatorColor = QVar5._0_8_;
  *(int *)((long)&(this->pageIndicatorColor).ct + 4) = QVar5.ct._4_4_;
  (this->pageIndicatorColor).ct.argb.pad = QVar5.ct._8_2_;
  iVar2 = FingerGeometry::width();
  dVar4 = (double)iVar2 * 0.3 * 0.5;
  iVar2 = (int)dVar4;
  this->radius = iVar2;
  this->smallRadius = (int)((double)(int)dVar4 * 0.75);
  this->buttonSize = iVar2 * 3;
  iVar2 = QStyleOption::~QStyleOption(&opt);
  return iVar2;
}

Assistant:

void
PageControlPrivate::init()
{
	QStyleOption opt;
	opt.initFrom( q );

	currentPageIndicatorColor = opt.palette.color( QPalette::Highlight );
	pageIndicatorColor = lighterColor( currentPageIndicatorColor, 75 );

	radius = FingerGeometry::width() * 0.3 / 2;

	smallRadius = radius * 0.75;

	buttonSize = radius * 3;
}